

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O3

FabSet * __thiscall amrex::FabSet::copyFrom(FabSet *this,FabSet *src,int scomp,int dcomp,int ncomp)

{
  bool bVar1;
  ulong uVar2;
  Periodicity *period;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long local_170;
  long local_168;
  Box local_12c;
  Array4<const_double> srcfab;
  Array4<double> dstfab;
  FabSetIter fsi;
  
  bVar1 = BoxArray::operator==
                    (&(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray,
                     &(src->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray);
  if ((bVar1) &&
     (bVar1 = DistributionMapping::operator==
                        (&(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          distributionMap,
                         &(src->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          distributionMap), bVar1)) {
    MFIter::MFIter(&fsi.super_MFIter,(FabArrayBase *)this,'\0');
    if (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex) {
      do {
        BATransformer::operator()
                  (&local_12c,
                   (BATransformer *)
                   (CONCAT44(fsi.super_MFIter.fabArray._4_4_,fsi.super_MFIter.fabArray._0_4_) + 8),
                   (Box *)((long)((fsi.super_MFIter.index_map)->
                                 super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[fsi.super_MFIter.currentIndex] *
                           0x1c + **(long **)(CONCAT44(fsi.super_MFIter.fabArray._4_4_,
                                                       fsi.super_MFIter.fabArray._0_4_) + 0x50)));
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&srcfab,(FabArray<amrex::FArrayBox> *)src,&fsi.super_MFIter);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&dstfab,(FabArray<amrex::FArrayBox> *)this,&fsi.super_MFIter);
        if (0 < ncomp) {
          lVar9 = (long)local_12c.smallend.vect[1];
          uVar2 = 0;
          local_170 = (long)scomp << 3;
          local_168 = (long)dcomp << 3;
          do {
            iVar7 = local_12c.smallend.vect[2];
            if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
              do {
                if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                  lVar3 = CONCAT44(srcfab.jstride._4_4_,(undefined4)srcfab.jstride) * 8;
                  lVar6 = (long)srcfab.p +
                          srcfab.nstride * local_170 +
                          (lVar9 - srcfab.begin.y) * lVar3 +
                          ((long)iVar7 - (long)srcfab.begin.z) * srcfab.kstride * 8 +
                          (long)srcfab.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                  lVar8 = (long)dstfab.p +
                          dstfab.nstride * local_168 +
                          ((long)iVar7 - (long)dstfab.begin.z) * dstfab.kstride * 8 +
                          (lVar9 - dstfab.begin.y) * dstfab.jstride * 8 + (long)dstfab.begin.x * -8
                          + (long)local_12c.smallend.vect[0] * 8;
                  lVar5 = lVar9;
                  do {
                    if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                      lVar4 = 0;
                      do {
                        *(undefined8 *)(lVar8 + lVar4 * 8) = *(undefined8 *)(lVar6 + lVar4 * 8);
                        lVar4 = lVar4 + 1;
                      } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                               (int)lVar4);
                    }
                    lVar5 = lVar5 + 1;
                    lVar6 = lVar6 + lVar3;
                    lVar8 = lVar8 + dstfab.jstride * 8;
                  } while (local_12c.bigend.vect[1] + 1 != (int)lVar5);
                }
                bVar1 = iVar7 != local_12c.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar1);
            }
            uVar2 = uVar2 + 1;
            local_170 = local_170 + 8;
            local_168 = local_168 + 8;
          } while (uVar2 != (uint)ncomp);
        }
        MFIter::operator++(&fsi.super_MFIter);
      } while (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex);
    }
    MFIter::~MFIter(&fsi.super_MFIter);
    return this;
  }
  period = Periodicity::NonPeriodic();
  fsi.super_MFIter.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  fsi.super_MFIter.fabArray._0_4_ = 0;
  srcfab.p = (double *)0x0;
  srcfab.jstride._0_4_ = 0;
  FabArray<amrex::FArrayBox>::ParallelCopy_nowait
            ((FabArray<amrex::FArrayBox> *)this,(FabArray<amrex::FArrayBox> *)src,scomp,dcomp,ncomp,
             (IntVect *)&fsi,(IntVect *)&srcfab,period,COPY,(CPC *)0x0,false);
  return this;
}

Assistant:

FabSet&
FabSet::copyFrom (const FabSet& src, int scomp, int dcomp, int ncomp)
{
    if (boxArray() == src.boxArray() && DistributionMap() == src.DistributionMap()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter fsi(*this); fsi.isValid(); ++fsi) {
            const Box& bx = fsi.validbox();
            auto const srcfab =   src.array(fsi);
            auto       dstfab = this->array(fsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dstfab(i,j,k,n+dcomp) = srcfab(i,j,k,n+scomp);
            });
        }
    } else {
        m_mf.ParallelCopy(src.m_mf,scomp,dcomp,ncomp);
    }
    return *this;
}